

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::InnerProductLayerParams::Clear(InnerProductLayerParams *this)

{
  Arena *pAVar1;
  InnerProductLayerParams *this_local;
  
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->weights_ != (WeightParams *)0x0)) &&
     (this->weights_ != (WeightParams *)0x0)) {
    (*(this->weights_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->weights_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->bias_ != (WeightParams *)0x0)) &&
     (this->bias_ != (WeightParams *)0x0)) {
    (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->bias_ = (WeightParams *)0x0;
  memset(&this->inputchannels_,0,0x12);
  return;
}

Assistant:

void InnerProductLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.InnerProductLayerParams)
  if (GetArenaNoVirtual() == NULL && weights_ != NULL) {
    delete weights_;
  }
  weights_ = NULL;
  if (GetArenaNoVirtual() == NULL && bias_ != NULL) {
    delete bias_;
  }
  bias_ = NULL;
  ::memset(&inputchannels_, 0, reinterpret_cast<char*>(&int8dynamicquantize_) -
    reinterpret_cast<char*>(&inputchannels_) + sizeof(int8dynamicquantize_));
}